

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O0

void __thiscall CTcParser::build_grammar_productions(CTcParser *this)

{
  CTcGramProdEntry *this_00;
  CTcParser *in_RDI;
  CTcGramProdEntry *entry;
  CTcGramProdEntry *in_stack_000000d8;
  CTcGenTarg *in_stack_000000e0;
  CTcPrsSymtab *in_stack_fffffffffffffff0;
  
  get_global_symtab(in_RDI);
  CTcPrsSymtab::enum_entries
            (in_stack_fffffffffffffff0,(_func_void_void_ptr_CTcSymbol_ptr *)in_RDI,(void *)0x21121a)
  ;
  for (this_00 = in_RDI->gramprod_head_; this_00 != (CTcGramProdEntry *)0x0;
      this_00 = CTcGramProdEntry::get_next(this_00)) {
    CTcGenTarg::gen_code_for_gramprod(in_stack_000000e0,in_stack_000000d8);
  }
  return;
}

Assistant:

void CTcParser::build_grammar_productions()
{
    CTcGramProdEntry *entry;

    /* 
     *   First, run through the symbol table and merge all of the private
     *   grammar rules into the master grammar rule list.  Since we've
     *   finished linking, we've already applied all modify/replace
     *   overrides, hence each symbol table entry referring to an object
     *   will contain its final private grammar rule list.  So, we can
     *   safely merge the private lists into the master lists at this point,
     *   since no more modifications to private lists are possible.  
     */
    get_global_symtab()->enum_entries(&build_grammar_cb, this);

    /* 
     *   iterate over the master list of productions and generate the image
     *   data for each one 
     */
    for (entry = gramprod_head_ ; entry != 0 ; entry = entry->get_next())
    {
        /* build this entry */
        G_cg->gen_code_for_gramprod(entry);
    }
}